

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

int __thiscall QDateTime::offsetFromUtc(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve;
  long in_FS_OFFSET;
  ZoneState ZStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    if ((~(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
          super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 6) == 0) {
      ZStack_28.offset = pQVar1->m_offsetFromUtc;
      goto LAB_0034883a;
    }
  }
  else if (((uint)pQVar1 & 0x36) == 6) {
    resolve.i = 0x424;
    if (-1 < (char)pQVar1) {
      resolve.i = 0x442;
    }
    QDateTimePrivate::localStateAtMillis(&ZStack_28,(long)pQVar1 >> 8,(TransitionOptions)resolve.i);
    goto LAB_0034883a;
  }
  ZStack_28.offset = 0;
LAB_0034883a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return ZStack_28.offset;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTime::offsetFromUtc() const
{
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;
    // But allow invalid date-time (e.g. gap's resolution) to report its offset.
    if (!d.isShort())
        return d->m_offsetFromUtc;

    auto spec = extractSpec(status);
    if (spec == Qt::LocalTime) {
        // We didn't cache the value, so we need to calculate it:
        const auto resolve = toTransitionOptions(extractDaylightStatus(status));
        return QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve).offset;
    }

    Q_ASSERT(spec == Qt::UTC);
    return 0;
}